

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void prepare_enc_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  ulong uVar1;
  ThreadData_conflict *__src;
  AV1_COMMON *cm;
  EncWorkerData *pEVar2;
  AVxWorker *pAVar3;
  EncWorkerData *pEVar4;
  FRAME_COUNTS *__dest;
  int32_t *piVar5;
  uint8_t *puVar6;
  int16_t *piVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  MvCosts *__dest_00;
  IntraBCMVCosts *__dest_01;
  uint8_t *puVar10;
  WinnerModeStats *pWVar11;
  tran_low_t *ptVar12;
  MB_RD_RECORD *pMVar13;
  inter_modes_info *piVar14;
  ThreadData_conflict *pTVar15;
  long lVar16;
  int iVar17;
  int x;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  __src = &cpi->td;
  cm = &cpi->common;
  uVar8 = (ulong)(uint)num_workers;
  do {
    if ((int)uVar8 < 1) {
      return;
    }
    uVar1 = uVar8 - 1;
    iVar17 = (int)uVar1;
    uVar9 = uVar1 & 0xffffffff;
    pAVar3 = (cpi->mt_info).workers;
    pEVar4 = (cpi->mt_info).tile_thr_data;
    pEVar2 = pEVar4 + uVar9;
    pAVar3[uVar9].hook = hook;
    pAVar3[uVar9].data1 = pEVar2;
    pAVar3[uVar9].data2 = (void *)0x0;
    pEVar4[uVar9].thread_id = iVar17;
    pEVar4[uVar9].start = iVar17;
    pEVar4[uVar9].cpi = cpi;
    pTVar15 = __src;
    if (iVar17 != 0) {
      pTVar15 = pEVar2->original_td;
    }
    pEVar2->td = pTVar15;
    pTVar15->intrabc_used = 0;
    pTVar15->deltaq_used = 0;
    pTVar15->abs_sum_level = 0;
    (pTVar15->rd_counts).seg_tmp_pred_cost[0] = 0;
    (pTVar15->rd_counts).seg_tmp_pred_cost[1] = 0;
    if (pTVar15 == __src) {
LAB_001b2efc:
      if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
        if ((cpi->sf).rd_sf.use_mb_rd_hash != 0) {
          pMVar13 = (MB_RD_RECORD *)aom_malloc(0x6248);
          (pTVar15->mb).txfm_search_info.mb_rd_record = pMVar13;
          if (pMVar13 == (MB_RD_RECORD *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate mb->txfm_search_info.mb_rd_record");
          }
        }
        if (((cm->current_frame).frame_type & 0xfd) != 0) {
          piVar14 = (inter_modes_info *)aom_malloc(0x53008);
          (pTVar15->mb).inter_modes_info = piVar14;
          if (piVar14 == (inter_modes_info *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate mb->inter_modes_info");
          }
        }
      }
    }
    else {
      memcpy(pTVar15,__src,0x256b0);
      memcpy(&pEVar2->td->rd_counts,&(cpi->td).rd_counts,0x598);
      pTVar15 = pEVar2->td;
      piVar5 = (pTVar15->obmc_buffer).mask;
      puVar10 = (pTVar15->obmc_buffer).above_pred;
      puVar6 = (pTVar15->obmc_buffer).left_pred;
      (pTVar15->mb).obmc_buffer.wsrc = (pTVar15->obmc_buffer).wsrc;
      (pTVar15->mb).obmc_buffer.mask = piVar5;
      (pTVar15->mb).obmc_buffer.above_pred = puVar10;
      (pTVar15->mb).obmc_buffer.left_pred = puVar6;
      lVar19 = 0;
      for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
        lVar16 = 2;
        lVar20 = lVar19;
        while (bVar21 = lVar16 != 0, lVar16 = lVar16 + -1, bVar21) {
          memcpy(*(void **)((long)pEVar2->td->hash_value_buffer[0] + lVar20),
                 *(void **)((long)(cpi->td).mb.intrabc_hash_info.hash_value_buffer[0] + lVar20),
                 0x4000);
          *(undefined8 *)((long)(pEVar2->td->mb).intrabc_hash_info.hash_value_buffer[0] + lVar20) =
               *(undefined8 *)((long)pEVar2->td->hash_value_buffer[0] + lVar20);
          lVar20 = lVar20 + 8;
        }
        lVar19 = lVar19 + 0x10;
      }
      if ((cpi->sf).inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        __dest_00 = (MvCosts *)aom_malloc(0x80028);
        pTVar15 = pEVar2->td;
        pTVar15->mv_costs_alloc = __dest_00;
        if (__dest_00 == (MvCosts *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate thread_data->td->mv_costs_alloc");
          pTVar15 = pEVar2->td;
          __dest_00 = pTVar15->mv_costs_alloc;
        }
        (pTVar15->mb).mv_costs = __dest_00;
        memcpy(__dest_00,(cpi->td).mb.mv_costs,0x80028);
      }
      pTVar15 = pEVar2->td;
      if ((cpi->sf).intra_sf.dv_cost_upd_level == INTERNAL_COST_UPD_OFF) goto LAB_001b2efc;
      (pTVar15->mb).dv_costs = (IntraBCMVCosts *)0x0;
      if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
        if ((((((cm->current_frame).frame_type & 0xfd) == 0) &&
             ((cpi->common).features.allow_screen_content_tools == true)) &&
            ((cpi->common).features.allow_intrabc != false)) &&
           (((cpi->oxcf).pass != AOM_RC_FIRST_PASS && (cpi->compressor_stage != '\x01')))) {
          __dest_01 = (IntraBCMVCosts *)aom_malloc(0x40018);
          pTVar15 = pEVar2->td;
          pTVar15->dv_costs_alloc = __dest_01;
          if (__dest_01 == (IntraBCMVCosts *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate thread_data->td->dv_costs_alloc");
            pTVar15 = pEVar2->td;
            __dest_01 = pTVar15->dv_costs_alloc;
          }
          (pTVar15->mb).dv_costs = __dest_01;
          memcpy(__dest_01,(cpi->td).mb.dv_costs,0x40018);
          pTVar15 = pEVar2->td;
        }
        goto LAB_001b2efc;
      }
    }
    av1_alloc_src_diff_buf(cm,&pTVar15->mb);
    puVar10 = (uint8_t *)aom_memalign(0x10,0x8000);
    (pTVar15->mb).e_mbd.seg_mask = puVar10;
    if (puVar10 == (uint8_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mb->e_mbd.seg_mask");
    }
    if (((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
        (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 || ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0)))
        ) && (uVar9 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type, uVar9 != 0)) {
      pWVar11 = (WinnerModeStats *)aom_malloc((long)winner_mode_count_allowed[uVar9] * 0x40f0);
      (pTVar15->mb).winner_mode_stats = pWVar11;
      if (pWVar11 == (WinnerModeStats *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mb->winner_mode_stats");
      }
    }
    ptVar12 = (tran_low_t *)
              aom_memalign(0x20,(long)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                             [((cpi->common).seq_params)->sb_size] & 0x1f)) << 2);
    (pTVar15->mb).dqcoeff_buf = ptVar12;
    if (ptVar12 == (tran_low_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mb->dqcoeff_buf");
    }
    av1_init_rtc_counters(&pEVar2->td->mb);
    pTVar15 = pEVar2->td;
    (pTVar15->mb).palette_pixels = 0;
    __dest = pTVar15->counts;
    if (__dest != &cpi->counts) {
      memcpy(__dest,&cpi->counts,0xc0);
    }
    bVar21 = uVar8 != 1;
    uVar8 = uVar1;
    if (bVar21) {
      pTVar15 = pEVar2->td;
      (pTVar15->mb).palette_buffer = pTVar15->palette_buffer;
      puVar10 = (pTVar15->comp_rd_buffer).pred1;
      (pTVar15->mb).comp_rd_buffer.pred0 = (pTVar15->comp_rd_buffer).pred0;
      (pTVar15->mb).comp_rd_buffer.pred1 = puVar10;
      piVar7 = (pTVar15->comp_rd_buffer).diff10;
      (pTVar15->mb).comp_rd_buffer.residual1 = (pTVar15->comp_rd_buffer).residual1;
      (pTVar15->mb).comp_rd_buffer.diff10 = piVar7;
      (pTVar15->mb).comp_rd_buffer.tmp_best_mask_buf = (pTVar15->comp_rd_buffer).tmp_best_mask_buf;
      (pEVar2->td->mb).tmp_conv_dst = pEVar2->td->tmp_conv_dst;
      for (lVar18 = 0; pTVar15 = pEVar2->td, lVar18 != 2; lVar18 = lVar18 + 1) {
        (pTVar15->mb).tmp_pred_bufs[lVar18] = pTVar15->tmp_pred_bufs[lVar18];
      }
      (pTVar15->mb).pixel_gradient_info = pTVar15->pixel_gradient_info;
      (pTVar15->mb).src_var_info_of_4x4_sub_blocks = pTVar15->src_var_info_of_4x4_sub_blocks;
      (pTVar15->mb).e_mbd.tmp_conv_dst = (pTVar15->mb).tmp_conv_dst;
      for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
        (pEVar2->td->mb).e_mbd.tmp_obmc_bufs[lVar18] = (pEVar2->td->mb).tmp_pred_bufs[lVar18];
      }
    }
  } while( true );
}

Assistant:

static inline void prepare_enc_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                                       int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1_COMMON *const cm = &cpi->common;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    thread_data->td->intrabc_used = 0;
    thread_data->td->deltaq_used = 0;
    thread_data->td->abs_sum_level = 0;
    thread_data->td->rd_counts.seg_tmp_pred_cost[0] = 0;
    thread_data->td->rd_counts.seg_tmp_pred_cost[1] = 0;

    // Before encoding a frame, copy the thread data from cpi.
    if (thread_data->td != &cpi->td) {
      thread_data->td->mb = cpi->td.mb;
      thread_data->td->rd_counts = cpi->td.rd_counts;
      thread_data->td->mb.obmc_buffer = thread_data->td->obmc_buffer;

      for (int x = 0; x < 2; x++) {
        for (int y = 0; y < 2; y++) {
          memcpy(thread_data->td->hash_value_buffer[x][y],
                 cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y],
                 AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
                     sizeof(*thread_data->td->hash_value_buffer[0][0]));
          thread_data->td->mb.intrabc_hash_info.hash_value_buffer[x][y] =
              thread_data->td->hash_value_buffer[x][y];
        }
      }
      // Keep these conditional expressions in sync with the corresponding ones
      // in accumulate_counters_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        CHECK_MEM_ERROR(
            cm, thread_data->td->mv_costs_alloc,
            (MvCosts *)aom_malloc(sizeof(*thread_data->td->mv_costs_alloc)));
        thread_data->td->mb.mv_costs = thread_data->td->mv_costs_alloc;
        memcpy(thread_data->td->mb.mv_costs, cpi->td.mb.mv_costs,
               sizeof(MvCosts));
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        // Reset dv_costs to NULL for worker threads when dv cost update is
        // enabled so that only dv_cost_upd_level needs to be checked before the
        // aom_free() call for the same.
        thread_data->td->mb.dv_costs = NULL;
        if (av1_need_dv_costs(cpi)) {
          CHECK_MEM_ERROR(cm, thread_data->td->dv_costs_alloc,
                          (IntraBCMVCosts *)aom_malloc(
                              sizeof(*thread_data->td->dv_costs_alloc)));
          thread_data->td->mb.dv_costs = thread_data->td->dv_costs_alloc;
          memcpy(thread_data->td->mb.dv_costs, cpi->td.mb.dv_costs,
                 sizeof(IntraBCMVCosts));
        }
      }
    }
    av1_alloc_mb_data(cpi, &thread_data->td->mb);

    // Reset rtc counters.
    av1_init_rtc_counters(&thread_data->td->mb);

    thread_data->td->mb.palette_pixels = 0;

    if (thread_data->td->counts != &cpi->counts) {
      memcpy(thread_data->td->counts, &cpi->counts, sizeof(cpi->counts));
    }

    if (i > 0) {
      thread_data->td->mb.palette_buffer = thread_data->td->palette_buffer;
      thread_data->td->mb.comp_rd_buffer = thread_data->td->comp_rd_buffer;
      thread_data->td->mb.tmp_conv_dst = thread_data->td->tmp_conv_dst;
      for (int j = 0; j < 2; ++j) {
        thread_data->td->mb.tmp_pred_bufs[j] =
            thread_data->td->tmp_pred_bufs[j];
      }
      thread_data->td->mb.pixel_gradient_info =
          thread_data->td->pixel_gradient_info;

      thread_data->td->mb.src_var_info_of_4x4_sub_blocks =
          thread_data->td->src_var_info_of_4x4_sub_blocks;

      thread_data->td->mb.e_mbd.tmp_conv_dst = thread_data->td->mb.tmp_conv_dst;
      for (int j = 0; j < 2; ++j) {
        thread_data->td->mb.e_mbd.tmp_obmc_bufs[j] =
            thread_data->td->mb.tmp_pred_bufs[j];
      }
    }
  }
}